

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

size_t __thiscall TcpSocketImpl::Write(TcpSocketImpl *this,void *buf,size_t len)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  pointer *__ptr;
  unsigned_long __n2;
  __array tmp;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  size_t local_30;
  size_t local_28;
  
  if ((this->super_BaseSocketImpl).m_bStop != false) {
    return 0;
  }
  if (len == 0) {
    return 0;
  }
  if (buf == (void *)0x0) {
    return 0;
  }
  if (this->m_bCloseReq != false) {
    return 0;
  }
  local_30 = len;
  if (BaseSocketImpl::s_fTrafficDebug.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator()
              (&BaseSocketImpl::s_fTrafficDebug,(unsigned_short)(this->super_BaseSocketImpl).m_fSock
               ,(char *)buf,len,true);
  }
  if (((this->m_fnSslInitDone).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (iVar2 = (*(this->m_fnSslInitDone)._M_invoker)((_Any_data *)&this->m_fnSslInitDone),
     sVar1 = local_30, iVar2 != 1)) {
    puVar3 = (uchar *)operator_new__(local_30);
    memset(puVar3,0,sVar1);
    local_38._M_head_impl = puVar3;
    if (sVar1 != 0) {
      memcpy(puVar3,buf,sVar1);
    }
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxOutDeque);
    if (iVar2 == 0) {
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&this->m_quTmpOutData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38,
                 &local_30);
      sVar1 = local_30;
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
      if (local_38._M_head_impl == (uchar *)0x0) {
        return sVar1;
      }
      operator_delete__(local_38._M_head_impl);
      return sVar1;
    }
    std::__throw_system_error(iVar2);
  }
  if ((this->m_fnSslEncode).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_28 = local_30;
    local_38._M_head_impl = (uchar *)buf;
    iVar2 = (*(this->m_fnSslEncode)._M_invoker)
                      ((_Any_data *)&this->m_fnSslEncode,&local_38._M_head_impl,&local_28);
    if (iVar2 != 0) goto LAB_0011a7c7;
  }
  sVar1 = local_30;
  puVar3 = (uchar *)operator_new__(local_30);
  memset(puVar3,0,sVar1);
  local_38._M_head_impl = puVar3;
  if (sVar1 != 0) {
    memcpy(puVar3,buf,sVar1);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxOutDeque);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  LOCK();
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
       (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + local_30;
  UNLOCK();
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  ::
  emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
            ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              *)&this->m_quOutData,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38,
             &local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
  if (local_38._M_head_impl != (uchar *)0x0) {
    operator_delete__(local_38._M_head_impl);
  }
  iVar2 = 1;
LAB_0011a7c7:
  if (0 < iVar2) {
    TriggerWriteThread(this);
  }
  return local_30;
}

Assistant:

size_t TcpSocketImpl::Write(const void* buf, size_t len)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0)
        return 0;

    if (s_fTrafficDebug != nullptr)
        s_fTrafficDebug(static_cast<uint16_t>(m_fSock), static_cast<const char*>(buf), len, true);

    if (m_fnSslInitDone != nullptr && m_fnSslInitDone() != 1)
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        lock_guard<mutex> lock(m_mxOutDeque);
        m_quTmpOutData.emplace_back(move(tmp), len);
        return len;
    }

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}